

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

node_type * __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
::new_leaf_root_node
          (btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
           *this,int max_count)

{
  node_type *pnVar1;
  
  pnVar1 = (node_type *)
           Allocate<8ul,std::allocator<std::pair<int,int>>>
                     ((allocator<std::pair<int,_int>_> *)this,(long)max_count * 8 + 0x10);
  if (((ulong)pnVar1 & 7) == 0) {
    *(node_type **)pnVar1 = pnVar1;
    *(undefined2 *)(pnVar1 + 8) = 0;
    pnVar1[10] = (node_type)0x0;
    pnVar1[0xb] = SUB41(max_count,0);
    return pnVar1;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned char, std::pair<int, int>, phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned char, std::pair<int, int>, phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = char]"
               );
}

Assistant:

node_type *new_leaf_root_node(const int max_count) {
            node_type *p = allocate(node_type::LeafSize(max_count));
            return node_type::init_leaf(p, p, max_count);
        }